

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O0

Code * __thiscall
r_exec::_TPX::build_mdl_head
          (_TPX *this,HLPBindingMap *bm,uint16_t tpl_arg_count,_Fact *lhs,_Fact *rhs,
          uint16_t *write_index)

{
  int iVar1;
  _Mem *p_Var2;
  Code *pCVar3;
  Code *pCVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ushort uVar5;
  Atom local_74 [4];
  Atom local_70 [4];
  Atom local_6c [4];
  Atom local_68 [4];
  Atom local_64 [6];
  ushort local_5e;
  Atom local_5c [4];
  Atom local_58 [2];
  uint16_t i;
  Atom local_44 [4];
  Code *local_40;
  Code *mdl;
  uint16_t *write_index_local;
  _Fact *rhs_local;
  _Fact *lhs_local;
  HLPBindingMap *pHStack_18;
  uint16_t tpl_arg_count_local;
  HLPBindingMap *bm_local;
  _TPX *this_local;
  
  mdl = (Code *)write_index;
  write_index_local = (uint16_t *)rhs;
  rhs_local = lhs;
  lhs_local._6_2_ = tpl_arg_count;
  pHStack_18 = bm;
  bm_local = (HLPBindingMap *)this;
  p_Var2 = _Mem::Get();
  r_code::Atom::Model((ushort)local_44,(uchar)Opcodes::Mdl);
  pCVar3 = (Code *)(**(code **)(*(long *)p_Var2 + 0x50))(p_Var2,local_44);
  r_code::Atom::~Atom(local_44);
  local_40 = pCVar3;
  pCVar4 = BindingMap::abstract_object(&pHStack_18->super_BindingMap,(Code *)rhs_local,false);
  (*(pCVar3->super__Object)._vptr__Object[0x19])(pCVar3,pCVar4);
  pCVar3 = local_40;
  pCVar4 = BindingMap::abstract_object
                     (&pHStack_18->super_BindingMap,(Code *)write_index_local,false);
  (*(pCVar3->super__Object)._vptr__Object[0x19])(pCVar3,pCVar4);
  *(undefined2 *)&(mdl->super__Object)._vptr__Object = 10;
  *(short *)&(mdl->super__Object)._vptr__Object = *(short *)&(mdl->super__Object)._vptr__Object + 1;
  r_code::Atom::IPointer((ushort)local_58);
  iVar1 = (*(local_40->super__Object)._vptr__Object[4])(local_40,1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),local_58);
  r_code::Atom::~Atom(local_58);
  r_code::Atom::Set((uchar)local_5c);
  iVar1 = (*(local_40->super__Object)._vptr__Object[4])
                    (local_40,(ulong)*(ushort *)&(mdl->super__Object)._vptr__Object);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar1),local_5c);
  r_code::Atom::~Atom(local_5c);
  for (local_5e = 0; local_5e < lhs_local._6_2_; local_5e = local_5e + 1) {
    r_code::Atom::VLPointer((ushort)local_64,local_5e);
    uVar5 = *(short *)&(mdl->super__Object)._vptr__Object + 1;
    *(ushort *)&(mdl->super__Object)._vptr__Object = uVar5;
    iVar1 = (*(local_40->super__Object)._vptr__Object[4])(local_40,(ulong)uVar5);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar1),local_64);
    r_code::Atom::~Atom(local_64);
  }
  *(short *)&(mdl->super__Object)._vptr__Object = *(short *)&(mdl->super__Object)._vptr__Object + 1;
  r_code::Atom::IPointer((ushort)local_68);
  iVar1 = (*(local_40->super__Object)._vptr__Object[4])(local_40,2);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar1),local_68);
  r_code::Atom::~Atom(local_68);
  r_code::Atom::Set((uchar)local_6c);
  iVar1 = (*(local_40->super__Object)._vptr__Object[4])
                    (local_40,(ulong)*(ushort *)&(mdl->super__Object)._vptr__Object);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar1),local_6c);
  r_code::Atom::~Atom(local_6c);
  r_code::Atom::RPointer((ushort)local_70);
  uVar5 = *(short *)&(mdl->super__Object)._vptr__Object + 1;
  *(ushort *)&(mdl->super__Object)._vptr__Object = uVar5;
  iVar1 = (*(local_40->super__Object)._vptr__Object[4])(local_40,(ulong)uVar5);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar1),local_70);
  r_code::Atom::~Atom(local_70);
  r_code::Atom::RPointer((ushort)local_74);
  uVar5 = *(short *)&(mdl->super__Object)._vptr__Object + 1;
  *(ushort *)&(mdl->super__Object)._vptr__Object = uVar5;
  iVar1 = (*(local_40->super__Object)._vptr__Object[4])(local_40,(ulong)uVar5);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar1),local_74);
  r_code::Atom::~Atom(local_74);
  return local_40;
}

Assistant:

Code *_TPX::build_mdl_head(HLPBindingMap *bm, uint16_t tpl_arg_count, _Fact *lhs, _Fact *rhs, uint16_t &write_index)
{
    Code *mdl = _Mem::Get()->build_object(Atom::Model(Opcodes::Mdl, MDL_ARITY));
    mdl->add_reference(bm->abstract_object(lhs, false)); // reference lhs.
    mdl->add_reference(bm->abstract_object(rhs, false)); // reference rhs.
    write_index = MDL_ARITY;
    mdl->code(MDL_TPL_ARGS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(tpl_arg_count);

    for (uint16_t i = 0; i < tpl_arg_count; ++i) {
        mdl->code(++write_index) = Atom::VLPointer(i);
    }

    mdl->code(MDL_OBJS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(2);
    mdl->code(++write_index) = Atom::RPointer(0);
    mdl->code(++write_index) = Atom::RPointer(1);
    return mdl;
}